

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

void __thiscall cnn::Cluster::add_word(Cluster *this,uint word)

{
  pointer puVar1;
  pointer puVar2;
  mapped_type *pmVar3;
  uint local_1c;
  
  puVar1 = (this->terminals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  puVar2 = (this->terminals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_1c = word;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->word2ind,&local_1c);
  *pmVar3 = (mapped_type)((ulong)((long)puVar1 - (long)puVar2) >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->terminals,&local_1c);
  return;
}

Assistant:

void Cluster::add_word(unsigned word) {
  assert (!initialized);
  assert (children.size() == 0);
  word2ind[word] = terminals.size();
  terminals.push_back(word);
}